

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testColor.cpp
# Opt level: O0

void testColor(void)

{
  bool bVar1;
  ostream *poVar2;
  Color4<float> *pCVar3;
  double dVar4;
  double b_3;
  double g_3;
  double r_3;
  Color3<double> tmp3d;
  Color3<double> r3d;
  Color3<double> c3d;
  double b_2;
  double g_2;
  double r_2;
  Color4<double> tmp4d;
  Color4<double> r4d;
  Color4<double> c4d;
  float b_1;
  float g_1;
  float r_1;
  C3f tmp3f;
  C3f r3f;
  C3f c3f;
  float b;
  float g;
  float r;
  C4f tmp4f;
  C4f r4f;
  C4f c4f;
  C4f tmp;
  C4f Y;
  C4f X;
  C4c B;
  C4c A;
  C4c testConstructor3;
  C4c testConstructor2;
  C4c testConstructor1i;
  C4c testConstructor1;
  C3c out3;
  C3c in3;
  PackedColor packed;
  float epsilon;
  undefined4 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdc;
  uchar in_stack_fffffffffffffcdd;
  uchar in_stack_fffffffffffffcde;
  uchar in_stack_fffffffffffffcdf;
  float in_stack_fffffffffffffce0;
  undefined2 in_stack_fffffffffffffce4;
  undefined1 in_stack_fffffffffffffce6;
  undefined1 in_stack_fffffffffffffce7;
  undefined1 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffce9;
  undefined1 in_stack_fffffffffffffcea;
  undefined1 in_stack_fffffffffffffceb;
  undefined1 in_stack_fffffffffffffcec;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffced;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  Color4<unsigned_char> *in_stack_fffffffffffffd00;
  Vec3<double> *in_stack_fffffffffffffd18;
  Color4<double> *in_stack_fffffffffffffd28;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  Color4<double> local_250;
  Color4<double> local_230;
  double local_210;
  double local_208;
  double local_200;
  Color4<double> local_1f8;
  Color4<double> local_1d8;
  Color4<double> local_1b8 [2];
  float local_164;
  float local_160;
  float local_15c;
  float local_140;
  float local_13c;
  float local_138;
  Color4<float> local_134;
  Color4<float> local_124;
  float local_114;
  float local_110;
  float local_10c;
  Color4<float> local_108;
  Color4<float> local_f8;
  Color4<float> local_e8;
  Color4<float> local_d8;
  Color4<float> local_c8;
  Color4<float> local_b8;
  Color4<float> local_a8;
  Color4<float> local_98;
  Color4<float> local_88;
  Color4<float> local_78;
  Color4<float> local_68;
  Color4<float> local_58;
  Color4<float> local_48;
  Color4<float> local_38;
  Color4<unsigned_char> local_26;
  Color4<unsigned_char> local_22;
  Color4<unsigned_char> local_1e;
  Color4<unsigned_char> local_1a;
  Color4<unsigned_char> local_16;
  Color4<unsigned_char> local_12;
  Vec3<unsigned_char> local_e;
  Vec3<unsigned_char> local_b;
  PackedColor local_8;
  float local_4;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Testing functions in ImathColor.h & ImathColorAlgo.h");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"rgb2packed -> packed2rgb");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_4 = std::numeric_limits<float>::epsilon();
  Imath_3_2::Color3<unsigned_char>::Color3
            ((Color3<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,
                               CONCAT24(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))),
             in_stack_fffffffffffffcdf,in_stack_fffffffffffffcde,in_stack_fffffffffffffcdd);
  Imath_3_2::Color3<unsigned_char>::Color3((Color3<unsigned_char> *)0x153df2);
  local_8 = Imath_3_2::rgb2packed<unsigned_char>((Vec3<unsigned_char> *)in_stack_fffffffffffffd00);
  Imath_3_2::packed2rgb<unsigned_char>
            (CONCAT13(in_stack_fffffffffffffce7,
                      CONCAT12(in_stack_fffffffffffffce6,in_stack_fffffffffffffce4)),
             (Vec3<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffcdf,
                      CONCAT16(in_stack_fffffffffffffcde,
                               CONCAT15(in_stack_fffffffffffffcdd,
                                        CONCAT14(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8
                                                )))));
  bVar1 = Imath_3_2::Vec3<unsigned_char>::operator==(&local_b,&local_e);
  if (!bVar1) {
    __assert_fail("in3 == out3",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x27,"void testColor()");
  }
  Imath_3_2::Color4<unsigned_char>::Color4(&local_12);
  Imath_3_2::Color4<unsigned_char>::Color4(&local_16,'\0');
  Imath_3_2::Color4<unsigned_char>::Color4(&local_1a,&local_16);
  Imath_3_2::Color4<unsigned_char>::operator=(&local_12,&local_1a);
  Imath_3_2::Color4<unsigned_char>::Color4(&local_1e,'4',0x80,0xfe,'\x7f');
  Imath_3_2::Color4<unsigned_char>::Color4(&local_22,&local_1e);
  Imath_3_2::Color4<unsigned_char>::Color4(&local_26);
  Imath_3_2::Color4<float>::Color4(&local_38);
  Imath_3_2::Color4<float>::Color4(&local_48);
  Imath_3_2::Color4<float>::Color4(&local_58);
  local_8 = Imath_3_2::rgb2packed<unsigned_char>(in_stack_fffffffffffffd00);
  Imath_3_2::packed2rgb<unsigned_char>
            (CONCAT13(in_stack_fffffffffffffce7,
                      CONCAT12(in_stack_fffffffffffffce6,in_stack_fffffffffffffce4)),
             (Color4<unsigned_char> *)
             CONCAT17(in_stack_fffffffffffffcdf,
                      CONCAT16(in_stack_fffffffffffffcde,
                               CONCAT15(in_stack_fffffffffffffcdd,
                                        CONCAT14(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8
                                                )))));
  bVar1 = Imath_3_2::Color4<unsigned_char>::operator==(&local_22,&local_26);
  if (!bVar1) {
    __assert_fail("A == B",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x38,"void testColor()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Imath::Color4 * f");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Imath::Color4 / f");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Assignment and comparison");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Color4<unsigned_char>::operator=(&local_26,&local_22);
  bVar1 = Imath_3_2::Color4<unsigned_char>::operator==(&local_26,&local_22);
  if (!bVar1) {
    __assert_fail("B == A",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x53,"void testColor()");
  }
  bVar1 = Imath_3_2::Color4<unsigned_char>::operator!=(&local_26,&local_22);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!(B != A)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x54,"void testColor()");
  }
  Imath_3_2::Color4<float>::Color4(&local_68,0.123,-0.42,0.501,0.998);
  pCVar3 = Imath_3_2::Color4<float>::operator=(&local_48,&local_68);
  Imath_3_2::Color4<float>::operator=(&local_38,pCVar3);
  Imath_3_2::Color4<float>::operator*=(&local_38,0.001);
  dVar4 = std::fabs((double)(ulong)(uint)(local_48.r * 0.001 + -local_38.r));
  uVar8 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_48.g * 0.001 + -local_38.g));
    uVar8 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_48.b * 0.001 + -local_38.b));
      uVar8 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_48.a * 0.001 + -local_38.a));
        uVar8 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if ((bool)uVar8 == false) {
    __assert_fail("std::fabs ((Y.r * 0.001f) - X.r) <= epsilon && std::fabs ((Y.g * 0.001f) - X.g) <= epsilon && std::fabs ((Y.b * 0.001f) - X.b) <= epsilon && std::fabs ((Y.a * 0.001f) - X.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x5e,"void testColor()");
  }
  Imath_3_2::Color4<float>::Color4(&local_78,0.123,-0.42,0.501,0.998);
  pCVar3 = Imath_3_2::Color4<float>::operator=(&local_48,&local_78);
  Imath_3_2::Color4<float>::operator=(&local_38,pCVar3);
  Imath_3_2::Color4<float>::operator/=(&local_38,-1.001);
  dVar4 = std::fabs((double)(ulong)(uint)(local_48.r / -1.001 - local_38.r));
  uVar7 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_48.g / -1.001 - local_38.g));
    uVar7 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_48.b / -1.001 - local_38.b));
      uVar7 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_48.a / -1.001 - local_38.a));
        uVar7 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if ((bool)uVar7 == false) {
    __assert_fail("std::fabs ((Y.r / -1.001f) - X.r) <= epsilon && std::fabs ((Y.g / -1.001f) - X.g) <= epsilon && std::fabs ((Y.b / -1.001f) - X.b) <= epsilon && std::fabs ((Y.a / -1.001f) - X.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x68,"void testColor()");
  }
  Imath_3_2::Color4<float>::Color4(&local_88,0.998,-0.001,0.501,1.001);
  Imath_3_2::Color4<float>::operator=(&local_48,&local_88);
  Imath_3_2::Color4<float>::Color4(&local_98,0.011,-0.42,-0.501,0.998);
  Imath_3_2::Color4<float>::operator=(&local_38,&local_98);
  Imath_3_2::Color4<float>::operator+
            ((Color4<float> *)
             CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffced,
                                                    CONCAT14(in_stack_fffffffffffffcec,
                                                             CONCAT13(in_stack_fffffffffffffceb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffcea,
                                                  CONCAT11(in_stack_fffffffffffffce9,
                                                           in_stack_fffffffffffffce8))))))),
             (Color4<float> *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,
                               CONCAT24(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))));
  Imath_3_2::Color4<float>::operator=(&local_58,&local_a8);
  dVar4 = std::fabs((double)(ulong)(uint)((local_38.r + local_48.r) - local_58.r));
  uVar6 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)((local_38.g + local_48.g) - local_58.g));
    uVar6 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)((local_38.b + local_48.b) - local_58.b));
      uVar6 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)((local_38.a + local_48.a) - local_58.a));
        uVar6 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if ((bool)uVar6 == false) {
    __assert_fail("std::fabs ((X.r + Y.r) - tmp.r) <= epsilon && std::fabs ((X.g + Y.g) - tmp.g) <= epsilon && std::fabs ((X.b + Y.b) - tmp.b) <= epsilon && std::fabs ((X.a + Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x73,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator-
            ((Color4<float> *)
             CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(in_stack_fffffffffffffcec,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffceb,
                                                  CONCAT12(in_stack_fffffffffffffcea,
                                                           CONCAT11(in_stack_fffffffffffffce9,
                                                                    in_stack_fffffffffffffce8)))))))
             ,(Color4<float> *)
              CONCAT17(in_stack_fffffffffffffce7,
                       CONCAT16(in_stack_fffffffffffffce6,
                                CONCAT24(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))));
  Imath_3_2::Color4<float>::operator=(&local_58,&local_b8);
  dVar4 = std::fabs((double)(ulong)(uint)((local_38.r - local_48.r) - local_58.r));
  uVar5 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)((local_38.g - local_48.g) - local_58.g));
    uVar5 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)((local_38.b - local_48.b) - local_58.b));
      uVar5 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)((local_38.a - local_48.a) - local_58.a));
        uVar5 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if ((bool)uVar5 == false) {
    __assert_fail("std::fabs ((X.r - Y.r) - tmp.r) <= epsilon && std::fabs ((X.g - Y.g) - tmp.g) <= epsilon && std::fabs ((X.b - Y.b) - tmp.b) <= epsilon && std::fabs ((X.a - Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x7b,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator*
            ((Color4<float> *)
             CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(
                                                  in_stack_fffffffffffffceb,
                                                  CONCAT12(in_stack_fffffffffffffcea,
                                                           CONCAT11(in_stack_fffffffffffffce9,
                                                                    in_stack_fffffffffffffce8)))))))
             ,(Color4<float> *)
              CONCAT17(in_stack_fffffffffffffce7,
                       CONCAT16(in_stack_fffffffffffffce6,
                                CONCAT24(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))));
  Imath_3_2::Color4<float>::operator=(&local_58,&local_c8);
  dVar4 = std::fabs((double)(ulong)(uint)(local_38.r * local_48.r + -local_58.r));
  bVar1 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_38.g * local_48.g + -local_58.g));
    bVar1 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_38.b * local_48.b + -local_58.b));
      bVar1 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_38.a * local_48.a + -local_58.a));
        bVar1 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if (bVar1 == false) {
    __assert_fail("std::fabs ((X.r * Y.r) - tmp.r) <= epsilon && std::fabs ((X.g * Y.g) - tmp.g) <= epsilon && std::fabs ((X.b * Y.b) - tmp.b) <= epsilon && std::fabs ((X.a * Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x83,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator/
            ((Color4<float> *)
             CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(uVar5,CONCAT13(bVar1,CONCAT12(
                                                  in_stack_fffffffffffffcea,
                                                  CONCAT11(in_stack_fffffffffffffce9,
                                                           in_stack_fffffffffffffce8))))))),
             (Color4<float> *)
             CONCAT17(in_stack_fffffffffffffce7,
                      CONCAT16(in_stack_fffffffffffffce6,
                               CONCAT24(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))));
  Imath_3_2::Color4<float>::operator=(&local_58,&local_d8);
  dVar4 = std::fabs((double)(ulong)(uint)(local_38.r / local_48.r - local_58.r));
  bVar1 = false;
  if (SUB84(dVar4,0) <= 1e-05) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_38.g / local_48.g - local_58.g));
    bVar1 = false;
    if (SUB84(dVar4,0) <= 1e-05) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_38.b / local_48.b - local_58.b));
      bVar1 = false;
      if (SUB84(dVar4,0) <= 1e-05) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_38.a / local_48.a - local_58.a));
        bVar1 = SUB84(dVar4,0) <= 1e-05;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f && std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f && std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f && std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x8e,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator=(&local_58,&local_38);
  Imath_3_2::Color4<float>::operator+=(&local_58,&local_48);
  dVar4 = std::fabs((double)(ulong)(uint)((local_38.r + local_48.r) - local_58.r));
  bVar1 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)((local_38.g + local_48.g) - local_58.g));
    bVar1 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)((local_38.b + local_48.b) - local_58.b));
      bVar1 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)((local_38.a + local_48.a) - local_58.a));
        bVar1 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("std::fabs ((X.r + Y.r) - tmp.r) <= epsilon && std::fabs ((X.g + Y.g) - tmp.g) <= epsilon && std::fabs ((X.b + Y.b) - tmp.b) <= epsilon && std::fabs ((X.a + Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0x97,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator=(&local_58,&local_38);
  Imath_3_2::Color4<float>::operator-=(&local_58,&local_48);
  dVar4 = std::fabs((double)(ulong)(uint)((local_38.r - local_48.r) - local_58.r));
  bVar1 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)((local_38.g - local_48.g) - local_58.g));
    bVar1 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)((local_38.b - local_48.b) - local_58.b));
      bVar1 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)((local_38.a - local_48.a) - local_58.a));
        bVar1 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if (!bVar1) {
    __assert_fail("std::fabs ((X.r - Y.r) - tmp.r) <= epsilon && std::fabs ((X.g - Y.g) - tmp.g) <= epsilon && std::fabs ((X.b - Y.b) - tmp.b) <= epsilon && std::fabs ((X.a - Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0xa0,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator=(&local_58,&local_38);
  Imath_3_2::Color4<float>::operator*=(&local_58,&local_48);
  dVar4 = std::fabs((double)(ulong)(uint)(local_38.r * local_48.r + -local_58.r));
  uVar8 = false;
  if (SUB84(dVar4,0) <= 1.1920929e-07) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_38.g * local_48.g + -local_58.g));
    uVar8 = false;
    if (SUB84(dVar4,0) <= 1.1920929e-07) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_38.b * local_48.b + -local_58.b));
      uVar8 = false;
      if (SUB84(dVar4,0) <= 1.1920929e-07) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_38.a * local_48.a + -local_58.a));
        uVar8 = SUB84(dVar4,0) <= 1.1920929e-07;
      }
    }
  }
  if ((bool)uVar8 == false) {
    __assert_fail("std::fabs ((X.r * Y.r) - tmp.r) <= epsilon && std::fabs ((X.g * Y.g) - tmp.g) <= epsilon && std::fabs ((X.b * Y.b) - tmp.b) <= epsilon && std::fabs ((X.a * Y.a) - tmp.a) <= epsilon"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0xa9,"void testColor()");
  }
  Imath_3_2::Color4<float>::operator=(&local_58,&local_38);
  Imath_3_2::Color4<float>::operator/=(&local_58,&local_48);
  dVar4 = std::fabs((double)(ulong)(uint)(local_38.r / local_48.r - local_58.r));
  uVar7 = false;
  if (SUB84(dVar4,0) <= 1e-05) {
    dVar4 = std::fabs((double)(ulong)(uint)(local_38.g / local_48.g - local_58.g));
    uVar7 = false;
    if (SUB84(dVar4,0) <= 1e-05) {
      dVar4 = std::fabs((double)(ulong)(uint)(local_38.b / local_48.b - local_58.b));
      uVar7 = false;
      if (SUB84(dVar4,0) <= 1e-05) {
        dVar4 = std::fabs((double)(ulong)(uint)(local_38.a / local_48.a - local_58.a));
        uVar7 = SUB84(dVar4,0) <= 1e-05;
      }
    }
  }
  if ((bool)uVar7 == false) {
    __assert_fail("std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f && std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f && std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f && std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                  ,0xb5,"void testColor()");
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"rgb2hsv and hsv2rgb");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Color4<float>::Color4(&local_e8);
  Imath_3_2::Color4<float>::Color4(&local_f8);
  Imath_3_2::Color4<float>::Color4(&local_108);
  local_10c = 0.0;
  do {
    if (1.0 < local_10c) {
      Imath_3_2::Color3<float>::Color3((Color3<float> *)0x15515b);
      Imath_3_2::Color3<float>::Color3((Color3<float> *)0x155168);
      Imath_3_2::Color3<float>::Color3((Color3<float> *)0x155175);
      for (local_15c = 0.0; local_15c <= 1.0; local_15c = local_15c + 1.0) {
        for (local_160 = 0.0; local_160 <= 1.0; local_160 = local_160 + 1.0) {
          for (local_164 = 0.0; local_164 <= 1.0; local_164 = local_164 + 1.0) {
            local_140 = local_15c;
            local_13c = local_160;
            local_138 = local_164;
            Imath_3_2::rgb2hsv<float>((Vec3<float> *)in_stack_fffffffffffffd18);
            Imath_3_2::Color3<float>::Color3<float>
                      ((Color3<float> *)
                       CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                              in_stack_fffffffffffffce0))),
                       (Vec3<float> *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           in_stack_fffffffffffffcd8)))));
            Imath_3_2::Color3<float>::operator=
                      ((Color3<float> *)
                       CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                              in_stack_fffffffffffffce0))),
                       (Color3<float> *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           in_stack_fffffffffffffcd8)))));
            Imath_3_2::hsv2rgb<float>((Vec3<float> *)in_stack_fffffffffffffd18);
            Imath_3_2::Color3<float>::Color3<float>
                      ((Color3<float> *)
                       CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                              in_stack_fffffffffffffce0))),
                       (Vec3<float> *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           in_stack_fffffffffffffcd8)))));
            Imath_3_2::Color3<float>::operator=
                      ((Color3<float> *)
                       CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                              in_stack_fffffffffffffce0))),
                       (Color3<float> *)
                       CONCAT17(in_stack_fffffffffffffcdf,
                                CONCAT16(in_stack_fffffffffffffcde,
                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                  CONCAT14(in_stack_fffffffffffffcdc,
                                                           in_stack_fffffffffffffcd8)))));
            bVar1 = Imath_3_2::equal<float,float,float>
                              ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                               in_stack_fffffffffffffce0,
                               (float)CONCAT13(in_stack_fffffffffffffcdf,
                                               CONCAT12(in_stack_fffffffffffffcde,
                                                        CONCAT11(in_stack_fffffffffffffcdd,
                                                                 in_stack_fffffffffffffcdc))));
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.x, c3f.x, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xda,"void testColor()");
            }
            bVar1 = Imath_3_2::equal<float,float,float>
                              ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                               in_stack_fffffffffffffce0,
                               (float)CONCAT13(in_stack_fffffffffffffcdf,
                                               CONCAT12(in_stack_fffffffffffffcde,
                                                        CONCAT11(in_stack_fffffffffffffcdd,
                                                                 in_stack_fffffffffffffcdc))));
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.y, c3f.y, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xdb,"void testColor()");
            }
            bVar1 = Imath_3_2::equal<float,float,float>
                              ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                               in_stack_fffffffffffffce0,
                               (float)CONCAT13(in_stack_fffffffffffffcdf,
                                               CONCAT12(in_stack_fffffffffffffcde,
                                                        CONCAT11(in_stack_fffffffffffffcdd,
                                                                 in_stack_fffffffffffffcdc))));
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3f.z, c3f.z, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xdc,"void testColor()");
            }
          }
        }
      }
      Imath_3_2::Color4<double>::Color4(local_1b8);
      Imath_3_2::Color4<double>::Color4(&local_1d8);
      Imath_3_2::Color4<double>::Color4(&local_1f8);
      local_200 = 0.0;
      do {
        if (1.0 < local_200) {
          Imath_3_2::Color3<double>::Color3((Color3<double> *)0x155692);
          Imath_3_2::Color3<double>::Color3((Color3<double> *)0x15569f);
          Imath_3_2::Color3<double>::Color3((Color3<double> *)0x1556ac);
          local_2a0 = 0.0;
          do {
            if (1.0 < local_2a0) {
              poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
              std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
              return;
            }
            for (local_2a8 = 0.0; local_2a8 <= 1.0; local_2a8 = local_2a8 + 1.0) {
              for (local_2b0 = 0.0; local_2b0 <= 1.0; local_2b0 = local_2b0 + 1.0) {
                Imath_3_2::rgb2hsv<double>(in_stack_fffffffffffffd18);
                Imath_3_2::Color3<double>::Color3<double>
                          ((Color3<double> *)
                           CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                                  in_stack_fffffffffffffce0))),
                           (Vec3<double> *)
                           CONCAT17(in_stack_fffffffffffffcdf,
                                    CONCAT16(in_stack_fffffffffffffcde,
                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                      CONCAT14(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8)))));
                Imath_3_2::Color3<double>::operator=
                          ((Color3<double> *)
                           CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                                  in_stack_fffffffffffffce0))),
                           (Color3<double> *)
                           CONCAT17(in_stack_fffffffffffffcdf,
                                    CONCAT16(in_stack_fffffffffffffcde,
                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                      CONCAT14(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8)))));
                Imath_3_2::hsv2rgb<double>(in_stack_fffffffffffffd18);
                Imath_3_2::Color3<double>::Color3<double>
                          ((Color3<double> *)
                           CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                                  in_stack_fffffffffffffce0))),
                           (Vec3<double> *)
                           CONCAT17(in_stack_fffffffffffffcdf,
                                    CONCAT16(in_stack_fffffffffffffcde,
                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                      CONCAT14(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8)))));
                Imath_3_2::Color3<double>::operator=
                          ((Color3<double> *)
                           CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(in_stack_fffffffffffffce4,
                                                                  in_stack_fffffffffffffce0))),
                           (Color3<double> *)
                           CONCAT17(in_stack_fffffffffffffcdf,
                                    CONCAT16(in_stack_fffffffffffffcde,
                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                      CONCAT14(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8)))));
                bVar1 = Imath_3_2::equal<double,double,float>
                                  ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                                   (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                    CONCAT16(in_stack_fffffffffffffcde,
                                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8)))),0.0);
                if (!bVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.x, c3d.x, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0x101,"void testColor()");
                }
                bVar1 = Imath_3_2::equal<double,double,float>
                                  ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                                   (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                    CONCAT16(in_stack_fffffffffffffcde,
                                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8)))),0.0);
                if (!bVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.y, c3d.y, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0x102,"void testColor()");
                }
                bVar1 = Imath_3_2::equal<double,double,float>
                                  ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                                   (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                    CONCAT16(in_stack_fffffffffffffcde,
                                                             CONCAT15(in_stack_fffffffffffffcdd,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8)))),0.0);
                if (!bVar1) {
                  __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r3d.z, c3d.z, 1e-5f)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                                ,0x103,"void testColor()");
                }
              }
            }
            local_2a0 = local_2a0 + 1.0;
          } while( true );
        }
        for (local_208 = 0.0; local_208 <= 1.0; local_208 = local_208 + 1.0) {
          for (local_210 = 0.0; local_210 <= 1.0; local_210 = local_210 + 1.0) {
            local_1b8[0].r = local_200;
            local_1b8[0].g = local_208;
            local_1b8[0].b = local_210;
            local_1b8[0].a = 1.0;
            Imath_3_2::rgb2hsv<double>(in_stack_fffffffffffffd28);
            Imath_3_2::Color4<double>::operator=(&local_1f8,&local_230);
            Imath_3_2::hsv2rgb<double>(in_stack_fffffffffffffd28);
            Imath_3_2::Color4<double>::operator=(&local_1d8,&local_250);
            bVar1 = Imath_3_2::equal<double,double,float>
                              ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                               (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                CONCAT16(in_stack_fffffffffffffcde,
                                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                                  CONCAT14(in_stack_fffffffffffffcdc
                                                                           ,
                                                  in_stack_fffffffffffffcd8)))),0.0);
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.r, c4d.r, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xed,"void testColor()");
            }
            bVar1 = Imath_3_2::equal<double,double,float>
                              ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                               (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                CONCAT16(in_stack_fffffffffffffcde,
                                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                                  CONCAT14(in_stack_fffffffffffffcdc
                                                                           ,
                                                  in_stack_fffffffffffffcd8)))),0.0);
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.g, c4d.g, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xee,"void testColor()");
            }
            bVar1 = Imath_3_2::equal<double,double,float>
                              ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                               (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                CONCAT16(in_stack_fffffffffffffcde,
                                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                                  CONCAT14(in_stack_fffffffffffffcdc
                                                                           ,
                                                  in_stack_fffffffffffffcd8)))),0.0);
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.b, c4d.b, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xef,"void testColor()");
            }
            bVar1 = Imath_3_2::equal<double,double,float>
                              ((double)CONCAT17(uVar8,CONCAT16(uVar7,CONCAT24(
                                                  in_stack_fffffffffffffce4,
                                                  in_stack_fffffffffffffce0))),
                               (double)CONCAT17(in_stack_fffffffffffffcdf,
                                                CONCAT16(in_stack_fffffffffffffcde,
                                                         CONCAT15(in_stack_fffffffffffffcdd,
                                                                  CONCAT14(in_stack_fffffffffffffcdc
                                                                           ,
                                                  in_stack_fffffffffffffcd8)))),0.0);
            if (!bVar1) {
              __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4d.a, c4d.a, 1e-5f)",
                            "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                            ,0xf0,"void testColor()");
            }
          }
        }
        local_200 = local_200 + 1.0;
      } while( true );
    }
    for (local_110 = 0.0; local_110 <= 1.0; local_110 = local_110 + 1.0) {
      for (local_114 = 0.0; local_114 <= 1.0; local_114 = local_114 + 1.0) {
        local_e8.r = local_10c;
        local_e8.g = local_110;
        local_e8.b = local_114;
        local_e8.a = 1.0;
        Imath_3_2::rgb2hsv<float>((Color4<float> *)in_stack_fffffffffffffd28);
        Imath_3_2::Color4<float>::operator=(&local_108,&local_124);
        Imath_3_2::hsv2rgb<float>((Color4<float> *)in_stack_fffffffffffffd28);
        Imath_3_2::Color4<float>::operator=(&local_f8,&local_134);
        bVar1 = Imath_3_2::equal<float,float,float>
                          ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                           in_stack_fffffffffffffce0,
                           (float)CONCAT13(in_stack_fffffffffffffcdf,
                                           CONCAT12(in_stack_fffffffffffffcde,
                                                    CONCAT11(in_stack_fffffffffffffcdd,
                                                             in_stack_fffffffffffffcdc))));
        if (!bVar1) {
          __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.r, c4f.r, 1e-5f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                        ,199,"void testColor()");
        }
        bVar1 = Imath_3_2::equal<float,float,float>
                          ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                           in_stack_fffffffffffffce0,
                           (float)CONCAT13(in_stack_fffffffffffffcdf,
                                           CONCAT12(in_stack_fffffffffffffcde,
                                                    CONCAT11(in_stack_fffffffffffffcdd,
                                                             in_stack_fffffffffffffcdc))));
        if (!bVar1) {
          __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.g, c4f.g, 1e-5f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                        ,200,"void testColor()");
        }
        bVar1 = Imath_3_2::equal<float,float,float>
                          ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                           in_stack_fffffffffffffce0,
                           (float)CONCAT13(in_stack_fffffffffffffcdf,
                                           CONCAT12(in_stack_fffffffffffffcde,
                                                    CONCAT11(in_stack_fffffffffffffcdd,
                                                             in_stack_fffffffffffffcdc))));
        if (!bVar1) {
          __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.b, c4f.b, 1e-5f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                        ,0xc9,"void testColor()");
        }
        bVar1 = Imath_3_2::equal<float,float,float>
                          ((float)CONCAT13(uVar8,CONCAT12(uVar7,in_stack_fffffffffffffce4)),
                           in_stack_fffffffffffffce0,
                           (float)CONCAT13(in_stack_fffffffffffffcdf,
                                           CONCAT12(in_stack_fffffffffffffcde,
                                                    CONCAT11(in_stack_fffffffffffffcdd,
                                                             in_stack_fffffffffffffcdc))));
        if (!bVar1) {
          __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (r4f.a, c4f.a, 1e-5f)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testColor.cpp"
                        ,0xca,"void testColor()");
        }
      }
    }
    local_10c = local_10c + 1.0;
  } while( true );
}

Assistant:

void
testColor ()
{
    cout << "Testing functions in ImathColor.h & ImathColorAlgo.h" << endl;

    cout << "rgb2packed -> packed2rgb" << endl;

    const float epsilon = std::numeric_limits<float>::epsilon ();

    IMATH_INTERNAL_NAMESPACE::PackedColor packed;
    IMATH_INTERNAL_NAMESPACE::C3c         in3 (52, 128, 254);
    IMATH_INTERNAL_NAMESPACE::C3c         out3;

    packed = IMATH_INTERNAL_NAMESPACE::rgb2packed (in3);
    IMATH_INTERNAL_NAMESPACE::packed2rgb (packed, out3);

    assert (in3 == out3);

    IMATH_INTERNAL_NAMESPACE::C4c testConstructor1;
    IMATH_INTERNAL_NAMESPACE::C4c testConstructor1i (0);
    IMATH_INTERNAL_NAMESPACE::C4c testConstructor2 (testConstructor1i);

    testConstructor1 =
        testConstructor2; // use these so the compiler doesn't emit a warning

    IMATH_INTERNAL_NAMESPACE::C4c testConstructor3 (52, 128, 254, 127);
    IMATH_INTERNAL_NAMESPACE::C4c A (testConstructor3);
    IMATH_INTERNAL_NAMESPACE::C4c B;
    IMATH_INTERNAL_NAMESPACE::C4f X, Y, tmp;

    packed = IMATH_INTERNAL_NAMESPACE::rgb2packed (A);
    IMATH_INTERNAL_NAMESPACE::packed2rgb (packed, B);

    assert (A == B);

    cout << "Imath::Color4 * f" << endl;

    assert (
        (IMATH_INTERNAL_NAMESPACE::C4f (0.330f, 0.710f, 0.010f, 0.999f) *
         0.999f) ==
        IMATH_INTERNAL_NAMESPACE::C4f (
            0.330f * 0.999f,
            0.710f * 0.999f,
            0.010f * 0.999f,
            0.999f * 0.999f));

    cout << "Imath::Color4 / f" << endl;

    assert (
        (IMATH_INTERNAL_NAMESPACE::C4f (0.330f, 0.710f, 0.010f, 0.999f) /
         0.999f) ==
        IMATH_INTERNAL_NAMESPACE::C4f (
            0.330f / 0.999f,
            0.710f / 0.999f,
            0.010f / 0.999f,
            0.999f / 0.999f));

    cout << "Assignment and comparison" << endl;

    B = A;
    assert (B == A);
    assert (!(B != A));

    X = Y = IMATH_INTERNAL_NAMESPACE::C4f (0.123f, -0.420f, 0.501f, 0.998f);

    X *= 0.001f;

    assert (
        std::fabs ((Y.r * 0.001f) - X.r) <= epsilon &&
        std::fabs ((Y.g * 0.001f) - X.g) <= epsilon &&
        std::fabs ((Y.b * 0.001f) - X.b) <= epsilon &&
        std::fabs ((Y.a * 0.001f) - X.a) <= epsilon);

    X = Y = IMATH_INTERNAL_NAMESPACE::C4f (0.123f, -0.420f, 0.501f, 0.998f);

    X /= -1.001f;

    assert (
        std::fabs ((Y.r / -1.001f) - X.r) <= epsilon &&
        std::fabs ((Y.g / -1.001f) - X.g) <= epsilon &&
        std::fabs ((Y.b / -1.001f) - X.b) <= epsilon &&
        std::fabs ((Y.a / -1.001f) - X.a) <= epsilon);

    Y = IMATH_INTERNAL_NAMESPACE::C4f (0.998f, -0.001f, 0.501f, 1.001f);
    X = IMATH_INTERNAL_NAMESPACE::C4f (0.011f, -0.420f, -0.501f, 0.998f);

    tmp = X + Y;

    assert (
        std::fabs ((X.r + Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g + Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b + Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a + Y.a) - tmp.a) <= epsilon);

    tmp = X - Y;

    assert (
        std::fabs ((X.r - Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g - Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b - Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a - Y.a) - tmp.a) <= epsilon);

    tmp = X * Y;

    assert (
        std::fabs ((X.r * Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g * Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b * Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a * Y.a) - tmp.a) <= epsilon);

    tmp = X / Y;

    //
    // epsilon doesn't work here.
    //
    assert (
        std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f &&
        std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f &&
        std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f &&
        std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f);

    tmp = X;
    tmp += Y;

    assert (
        std::fabs ((X.r + Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g + Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b + Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a + Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp -= Y;

    assert (
        std::fabs ((X.r - Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g - Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b - Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a - Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp *= Y;

    assert (
        std::fabs ((X.r * Y.r) - tmp.r) <= epsilon &&
        std::fabs ((X.g * Y.g) - tmp.g) <= epsilon &&
        std::fabs ((X.b * Y.b) - tmp.b) <= epsilon &&
        std::fabs ((X.a * Y.a) - tmp.a) <= epsilon);

    tmp = X;
    tmp /= Y;

    //
    // epsilon doesn't work here.
    //
    assert (
        std::fabs ((X.r / Y.r) - tmp.r) <= 1e-5f &&
        std::fabs ((X.g / Y.g) - tmp.g) <= 1e-5f &&
        std::fabs ((X.b / Y.b) - tmp.b) <= 1e-5f &&
        std::fabs ((X.a / Y.a) - tmp.a) <= 1e-5f);

    cout << "rgb2hsv and hsv2rgb" << endl;

    // C4f
    
    IMATH_INTERNAL_NAMESPACE::C4f c4f, r4f, tmp4f;

    for (float r=0.0f; r<=1.0; r += 1.0f)
        for (float g=0.0f; g<=1.0; g += 1.0f)
            for (float b=0.0f; b<=1.0; b += 1.0f)
            {
                c4f.r = r;
                c4f.g = g;
                c4f.b = b;
                c4f.a = 1.0f;
                tmp4f = rgb2hsv(c4f);
                r4f = hsv2rgb(tmp4f);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.r, c4f.r, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.g, c4f.g, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.b, c4f.b, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4f.a, c4f.a, 1e-5f));
            }
    
    // C3f
    
    IMATH_INTERNAL_NAMESPACE::C3f c3f, r3f, tmp3f;

    for (float r=0.0f; r<=1.0; r += 1.0f)
        for (float g=0.0f; g<=1.0; g += 1.0f)
            for (float b=0.0f; b<=1.0; b += 1.0f)
            {
                c3f.x = r;
                c3f.y = g;
                c3f.z = b;
                tmp3f = rgb2hsv(c3f);
                r3f = hsv2rgb(tmp3f);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.x, c3f.x, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.y, c3f.y, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3f.z, c3f.z, 1e-5f));
            }
    
    // C4d
    
    IMATH_INTERNAL_NAMESPACE::Color4<double> c4d, r4d, tmp4d;

    for (double r=0.0; r<=1.0; r += 1.0)
        for (double g=0.0; g<=1.0; g += 1.0)
            for (double b=0.0; b<=1.0; b += 1.0)
            {
                c4d.r = r;
                c4d.g = g;
                c4d.b = b;
                c4d.a = 1.0;
                tmp4d = rgb2hsv(c4d);
                r4d = hsv2rgb(tmp4d);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.r, c4d.r, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.g, c4d.g, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.b, c4d.b, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r4d.a, c4d.a, 1e-5f));
            }
    

    // C3d
    
    IMATH_INTERNAL_NAMESPACE::Color3<double> c3d, r3d, tmp3d;

    for (double r=0.0; r<=1.0; r += 1.0)
        for (double g=0.0; g<=1.0; g += 1.0)
            for (double b=0.0; b<=1.0; b += 1.0)
            {
                c3d.x = r;
                c3d.y = g;
                c3d.z = b;
                tmp3d = rgb2hsv(c3d);
                r3d = hsv2rgb(tmp3d);
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.x, c3d.x, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.y, c3d.y, 1e-5f));
                assert (IMATH_INTERNAL_NAMESPACE::equal (r3d.z, c3d.z, 1e-5f));
            }
    
    cout << "ok\n" << endl;
}